

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O2

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeCornerAngles
          (IntrinsicGeometryInterface *this)

{
  double dVar1;
  pointer puVar2;
  undefined8 uVar3;
  bool bVar4;
  size_t sVar5;
  ulong uVar6;
  runtime_error *this_00;
  double *pdVar7;
  ulong uVar8;
  size_t i;
  ulong uVar9;
  size_t i_1;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  allocator local_161;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> __begin2;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> __end2;
  MeshData<geometrycentral::surface::Corner,_double> local_70;
  RangeSetBase<geometrycentral::surface::CornerRangeF> local_38;
  
  DependentQuantity::ensureHave(&(this->edgeLengthsQ).super_DependentQuantity);
  MeshData<geometrycentral::surface::Corner,_double>::MeshData
            (&local_70,(this->super_BaseGeometryInterface).mesh);
  MeshData<geometrycentral::surface::Corner,_double>::operator=(&this->cornerAngles,&local_70);
  MeshData<geometrycentral::surface::Corner,_double>::~MeshData(&local_70);
  local_38.mesh = (this->super_BaseGeometryInterface).mesh;
  local_38.iEnd = (local_38.mesh)->nHalfedgesFillCount;
  local_38.iStart = 0;
  RangeSetBase<geometrycentral::surface::CornerRangeF>::begin(&__begin2,&local_38);
  RangeSetBase<geometrycentral::surface::CornerRangeF>::end(&__end2,&local_38);
  while( true ) {
    sVar5 = __begin2.iCurr;
    if (__begin2.iCurr == __end2.iCurr) {
      return;
    }
    puVar2 = ((__begin2.mesh)->heNextArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = puVar2[__begin2.iCurr];
    uVar6 = puVar2[uVar8];
    if (puVar2[uVar6] != __begin2.iCurr) break;
    if ((__begin2.mesh)->useImplicitTwinFlag == true) {
      pdVar7 = (this->edgeLengths).data.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar8 = uVar8 >> 1;
      uVar9 = __begin2.iCurr >> 1;
      uVar6 = uVar6 >> 1;
    }
    else {
      puVar2 = ((__begin2.mesh)->heEdgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->edgeLengths).data.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar8 = puVar2[uVar8];
      uVar9 = puVar2[__begin2.iCurr];
      uVar6 = puVar2[uVar6];
    }
    dVar10 = pdVar7[uVar6];
    dVar1 = pdVar7[uVar9];
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar1;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = pdVar7[uVar8];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar10 * dVar10;
    auVar12 = vfmadd231sd_fma(auVar14,auVar12,auVar12);
    auVar12 = vfnmadd231sd_fma(auVar12,auVar11,auVar11);
    auVar13._0_8_ = auVar12._0_8_ / ((dVar1 + dVar1) * dVar10);
    auVar13._8_8_ = auVar12._8_8_;
    uVar3 = vcmpsd_avx512f(ZEXT816(0x3ff0000000000000),auVar13,1);
    bVar4 = (bool)((byte)uVar3 & 1);
    auVar12 = vmaxsd_avx(ZEXT816(0xbff0000000000000),auVar13);
    dVar10 = acos((double)((ulong)bVar4 * 0x3ff0000000000000 + (ulong)!bVar4 * auVar12._0_8_));
    (this->cornerAngles).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_data[sVar5] = dVar10;
    RangeIteratorBase<geometrycentral::surface::CornerRangeF>::operator++(&__begin2);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_128,
             "/workspace/llm4binary/github/license_c_cmakelists/nmwsharp[P]gc-polyscope-project-template/deps/geometry-central/src/surface/intrinsic_geometry_interface.cpp"
             ,&local_161);
  ::std::operator+(&local_108,"GC_SAFETY_ASSERT FAILURE from ",&local_128);
  ::std::operator+(&local_e8,&local_108,":");
  ::std::__cxx11::to_string(&local_148,0x75);
  ::std::operator+(&local_c8,&local_e8,&local_148);
  ::std::operator+(&local_a8,&local_c8," - ");
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                   &local_a8,"faces must be triangular");
  ::std::runtime_error::runtime_error(this_00,(string *)&local_70);
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void IntrinsicGeometryInterface::computeCornerAngles() {
  edgeLengthsQ.ensureHave();

  cornerAngles = CornerData<double>(mesh);

  for (Corner c : mesh.corners()) {
    // WARNING: Logic duplicated between cached and immediate version
    Halfedge heA = c.halfedge();
    Halfedge heOpp = heA.next();
    Halfedge heB = heOpp.next();

    GC_SAFETY_ASSERT(heB.next() == heA, "faces must be triangular");

    double lOpp = edgeLengths[heOpp.edge()];
    double lA = edgeLengths[heA.edge()];
    double lB = edgeLengths[heB.edge()];

    double q = (lA * lA + lB * lB - lOpp * lOpp) / (2. * lA * lB);
    q = clamp(q, -1.0, 1.0);
    double angle = std::acos(q);

    cornerAngles[c] = angle;
  }
}